

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::Field> *
wasm::WATParser::anon_unknown_11::
fieldtype<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>
          (Result<wasm::Field> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  ParseInput *this;
  __index_type *p_Var1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  __index_type *p_Var6;
  undefined8 uVar7;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string local_f0 [32];
  string local_d0;
  undefined1 local_b0 [8];
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  Result<wasm::Field> field;
  
  this = &ctx->in;
  expected._M_str = "mut";
  expected._M_len = 3;
  bVar3 = ParseInput::takeSExprStart(this,expected);
  uVar7._0_1_ = '\x02';
  uVar7._1_7_ = 0;
  expected_00._M_str = "i8";
  expected_00._M_len = 2;
  bVar4 = ParseInput::takeKeyword(this,expected_00);
  if ((bVar4) ||
     (expected_01._M_str = "i16", expected_01._M_len = 3,
     bVar4 = ParseInput::takeKeyword(this,expected_01), bVar4)) {
    type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index = '\x02';
    type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_ = 0;
    field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._24_1_ = 0;
  }
  else {
    p_Var1 = (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20);
    valtype<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>
              ((Result<wasm::Type> *)p_Var1,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)local_b0,
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)p_Var1);
    if (_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string(local_f0,(string *)local_b0);
      std::__detail::__variant::_Variant_storage<false,wasm::Field,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::Field,wasm::WATParser::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20),local_f0);
      std::__cxx11::string::~string(local_f0);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_b0);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_b0);
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index =
           _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index;
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_ =
           _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_;
      field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._24_1_ = 0;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
  }
  p_Var1 = (__index_type *)
           ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Field,_wasm::WATParser::Err> *)
                  ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20),
                  (_Copy_ctor_base<false,_wasm::Field,_wasm::WATParser::Err> *)p_Var1);
  if (type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)local_b0,
               (string *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Field,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::Field,wasm::WATParser::Err> *)__return_storage_ptr__,
               local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
    if (bVar3) {
      bVar3 = ParseInput::takeRParen(this);
      if (!bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"expected end of field type",(allocator<char> *)local_b0);
        ParseInput::err((Err *)((long)&_val.val.
                                       super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> +
                               0x20),this,&local_d0);
        std::__detail::__variant::_Variant_storage<false,wasm::Field,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::Field,wasm::WATParser::Err> *)
                   __return_storage_ptr__,
                   (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
        std::__cxx11::string::~string((string *)&local_d0);
        goto LAB_00a7cc53;
      }
      uVar5 = 0x100000000;
    }
    else {
      uVar5 = 0;
    }
    p_Var6 = (__index_type *)0x0;
    if (field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._24_1_ == '\0') {
      p_Var6 = p_Var1;
    }
    uVar2 = *(uint *)(p_Var6 + 8);
    if ((ulong)uVar2 == 0) {
      uVar7 = type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> = uVar7;
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 8) =
         uVar2 | uVar5;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x20) = '\0';
  }
LAB_00a7cc53:
  std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err> *)
                    ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldT> fieldtype(Ctx& ctx) {
  auto mutability = Immutable;
  if (ctx.in.takeSExprStart("mut"sv)) {
    mutability = Mutable;
  }

  auto field = storagetype(ctx);
  CHECK_ERR(field);

  if (mutability == Mutable) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of field type");
    }
  }

  return ctx.makeFieldType(*field, mutability);
}